

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trsort.c
# Opt level: O0

void tr_partition(saidx64_t *ISAd,saidx64_t *first,saidx64_t *middle,saidx64_t *last,saidx64_t **pa,
                 saidx64_t **pb,saidx64_t v)

{
  saidx64_t sVar1;
  long lVar2;
  bool bVar3;
  saidx64_t x;
  saidx64_t s;
  saidx64_t t;
  saidx64_t *f;
  saidx64_t *e;
  saidx64_t *d;
  saidx64_t *c;
  saidx64_t *b;
  saidx64_t *a;
  saidx64_t **pb_local;
  saidx64_t **pa_local;
  saidx64_t *last_local;
  saidx64_t *middle_local;
  saidx64_t *first_local;
  saidx64_t *ISAd_local;
  
  x = 0;
  b = middle + -1;
  do {
    b = b + 1;
    bVar3 = false;
    if (b < last) {
      x = ISAd[*b];
      bVar3 = x == v;
    }
  } while (bVar3);
  c = last;
  a = b;
  if ((b < last) && (x < v)) {
    while( true ) {
      b = b + 1;
      bVar3 = false;
      if (b < last) {
        x = ISAd[*b];
        bVar3 = x <= v;
      }
      if (!bVar3) break;
      if (x == v) {
        lVar2 = *b;
        *b = *a;
        *a = lVar2;
        a = a + 1;
      }
    }
  }
  do {
    d = c + -1;
    bVar3 = false;
    if (b < d) {
      x = ISAd[*d];
      bVar3 = x == v;
    }
    c = d;
  } while (bVar3);
  if ((b < d) && (v < x)) {
    while( true ) {
      c = c + -1;
      bVar3 = false;
      if (b < c) {
        x = ISAd[*c];
        bVar3 = v <= x;
      }
      if (!bVar3) break;
      if (x == v) {
        lVar2 = *c;
        *c = *d;
        *d = lVar2;
        d = d + -1;
      }
    }
  }
  while (b < c) {
    sVar1 = *b;
    *b = *c;
    *c = sVar1;
    while( true ) {
      b = b + 1;
      bVar3 = false;
      if (b < c) {
        x = ISAd[*b];
        bVar3 = x <= v;
      }
      if (!bVar3) break;
      if (x == v) {
        lVar2 = *b;
        *b = *a;
        *a = lVar2;
        a = a + 1;
      }
    }
    while( true ) {
      c = c + -1;
      bVar3 = false;
      if (b < c) {
        x = ISAd[*c];
        bVar3 = v <= x;
      }
      if (!bVar3) break;
      if (x == v) {
        lVar2 = *c;
        *c = *d;
        *d = lVar2;
        d = d + -1;
      }
    }
  }
  last_local = last;
  first_local = first;
  if (a <= d) {
    s = (long)a - (long)first >> 3;
    lVar2 = (long)b - (long)a >> 3;
    if (lVar2 < s) {
      s = lVar2;
    }
    f = b + -s;
    e = first;
    for (; 0 < s; s = s + -1) {
      sVar1 = *e;
      *e = *f;
      *f = sVar1;
      e = e + 1;
      f = f + 1;
    }
    s = (long)d - (long)(b + -1) >> 3;
    lVar2 = ((long)last - (long)d >> 3) + -1;
    if (lVar2 < s) {
      s = lVar2;
    }
    e = b;
    f = last + -s;
    for (; 0 < s; s = s + -1) {
      sVar1 = *e;
      *e = *f;
      *f = sVar1;
      e = e + 1;
      f = f + 1;
    }
    first_local = first + ((long)b - (long)a >> 3);
    last_local = last + -((long)d - (long)(b + -1) >> 3);
  }
  *pa = first_local;
  *pb = last_local;
  return;
}

Assistant:

static INLINE
void
tr_partition(const saidx_t *ISAd,
             saidx_t *first, saidx_t *middle, saidx_t *last,
             saidx_t **pa, saidx_t **pb, saidx_t v) {
  saidx_t *a, *b, *c, *d, *e, *f;
  saidx_t t, s;
  saidx_t x = 0;

  for(b = middle - 1; (++b < last) && ((x = ISAd[*b]) == v);) { }
  if(((a = b) < last) && (x < v)) {
    for(; (++b < last) && ((x = ISAd[*b]) <= v);) {
      if(x == v) { SWAP(*b, *a); ++a; }
    }
  }
  for(c = last; (b < --c) && ((x = ISAd[*c]) == v);) { }
  if((b < (d = c)) && (x > v)) {
    for(; (b < --c) && ((x = ISAd[*c]) >= v);) {
      if(x == v) { SWAP(*c, *d); --d; }
    }
  }
  for(; b < c;) {
    SWAP(*b, *c);
    for(; (++b < c) && ((x = ISAd[*b]) <= v);) {
      if(x == v) { SWAP(*b, *a); ++a; }
    }
    for(; (b < --c) && ((x = ISAd[*c]) >= v);) {
      if(x == v) { SWAP(*c, *d); --d; }
    }
  }

  if(a <= d) {
    c = b - 1;
    if((s = a - first) > (t = b - a)) { s = t; }
    for(e = first, f = b - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }
    if((s = d - c) > (t = last - d - 1)) { s = t; }
    for(e = b, f = last - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }
    first += (b - a), last -= (d - c);
  }
  *pa = first, *pb = last;
}